

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int jsondec_rawpeek(jsondec *d)

{
  byte bVar1;
  
  if (d->ptr == d->end) {
    jsondec_err(d,"Unexpected EOF");
  }
  bVar1 = *d->ptr;
  if (9 < bVar1 - 0x30) {
    if (bVar1 == 0x22) {
      return 2;
    }
    if (bVar1 != 0x2d) {
      if (bVar1 == 0x7b) {
        return 0;
      }
      if (bVar1 == 0x66) {
        return 5;
      }
      if (bVar1 == 0x6e) {
        return 6;
      }
      if (bVar1 != 0x74) {
        if (bVar1 == 0x5b) {
          return 1;
        }
        jsondec_errf(d,"Unexpected character: \'%c\'",(ulong)(uint)(int)(char)bVar1);
      }
      return 4;
    }
  }
  return 3;
}

Assistant:

static int jsondec_rawpeek(jsondec* d) {
  if (d->ptr == d->end) {
    jsondec_err(d, "Unexpected EOF");
  }

  switch (*d->ptr) {
    case '{':
      return JD_OBJECT;
    case '[':
      return JD_ARRAY;
    case '"':
      return JD_STRING;
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      return JD_NUMBER;
    case 't':
      return JD_TRUE;
    case 'f':
      return JD_FALSE;
    case 'n':
      return JD_NULL;
    default:
      jsondec_errf(d, "Unexpected character: '%c'", *d->ptr);
  }
}